

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_effect(parser *p)

{
  void *pvVar1;
  effect *effect_00;
  effect *new_effect;
  effect *effect;
  monster_spell *s;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    effect_00 = (effect *)mem_zalloc(0x38);
    if (*(long *)((long)pvVar1 + 0x18) == 0) {
      *(effect **)((long)pvVar1 + 0x18) = effect_00;
    }
    else {
      for (new_effect = *(effect **)((long)pvVar1 + 0x18); new_effect->next != (effect *)0x0;
          new_effect = new_effect->next) {
      }
      new_effect->next = effect_00;
    }
    p_local._4_4_ = grab_effect_data(p,effect_00);
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_effect(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct effect *effect, *new_effect;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	new_effect = mem_zalloc(sizeof(*new_effect));
	/* Go to the next vacant effect and set it to the new one  */
	if (s->effect) {
		effect = s->effect;
		while (effect->next)
			effect = effect->next;
		effect->next = new_effect;
	} else {
		s->effect = new_effect;
	}

	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}